

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execDivs<(moira::Core)0,(moira::Instr)54,(moira::Mode)0,2>(Moira *this,u16 opcode)

{
  ulong in_RAX;
  undefined8 uVar1;
  ulong uStack_18;
  bool divByZero;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  execDivsMusashi<(moira::Core)0,(moira::Instr)54,(moira::Mode)0,2>(this,opcode,&divByZero);
  uVar1 = 0x9e;
  if (divByZero != false) {
    uVar1 = 0x26;
  }
  (*this->_vptr_Moira[2])(this,uVar1);
  return;
}

Assistant:

void
Moira::execDivs(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    bool divByZero = false;

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        execDivsMusashi<C, I, M, S>(opcode, &divByZero);
    } else {
        execDivsMoira<C, I, M, S>(opcode, &divByZero);
    }

    if (divByZero) {

        CYCLES_68000(38);
        CYCLES_68010(44);
        CYCLES_68020(38);

    } else {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_DN   ( 0,  0,  0,      158,122, 56,        0,  0,  0)
        CYCLES_AI   ( 0,  0,  0,      162,126, 60,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,      162,126, 60,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,      164,128, 61,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,      166,130, 61,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,      168,132, 63,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,      166,130, 60,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,      170,134, 60,        0,  0,  0)
        CYCLES_DIPC ( 0,  0,  0,      166,130, 61,        0,  0,  0)
        CYCLES_IXPC ( 0,  0,  0,      168,132, 63,        0,  0,  0)
        CYCLES_IM   ( 0,  0,  0,      162,126, 58,        0,  0,  0)
    }

    FINALIZE
}